

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_int>::locate_pivots(Suffix_Array<unsigned_int> *this,idx_t *P)

{
  ostream *poVar1;
  nanoseconds *in_RDI;
  rep_conflict rVar2;
  time_point t_e;
  anon_class_24_3_9ded7624 locate;
  idx_t subarr_size;
  time_point t_s;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 conservative;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  anon_class_24_3_9ded7624 *in_stack_ffffffffffffffc0;
  uint local_1c;
  undefined8 local_18;
  
  conservative = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  local_18 = std::chrono::_V2::system_clock::now();
  local_1c = (uint)in_RDI[1].__r / (uint)in_RDI[6].__r;
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_int>::locate_pivots(unsigned_int*)const::_lambda(unsigned_int)_1_const&>
            ((size_t)&local_1c,(size_t)in_RDI,in_stack_ffffffffffffffc0,
             (long)in_stack_ffffffffffffffb8,(bool)conservative);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Located the pivots in each sorted subarray. Time taken: ");
  std::chrono::operator-
            (in_stack_ffffffffffffffb8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1);
  rVar2 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar1,in_RDI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::locate_pivots(idx_t* const P) const
{
    const auto t_s = now();

    const auto subarr_size = n_ / p_;   // Size of each independent sorted subarray.

    const auto locate =
        [&](const idx_t i)
        {
            const auto X_i = SA_ + i * subarr_size; // The i'th subarray.
            const auto P_i = P + i * (p_ + 1);  // Pivot locations in `X_i` are to be placed in `P_i`.

            const auto tot_subarr_size = subarr_size + (i < p_ - 1 ? 0 : n_ % p_);
            P_i[0] = 0, P_i[p_] = tot_subarr_size; // The two flanking pivot indices.

            for(idx_t j = 0; j < p_ - 1; ++j) // TODO: try parallelizing this loop too; observe performance diff.
                P_i[j + 1] = upper_bound(X_i, tot_subarr_size, T_ + pivot_[j], n_ - pivot_[j]); // TODO: can shrink the search-range for successive searches.
        };

    parlay::parallel_for(0, p_, locate, 1);

    const auto t_e = now();
    std::cerr << "Located the pivots in each sorted subarray. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}